

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * slang::ast::EnumType::findDefinition
                 (Compilation *comp,EnumTypeSyntax *syntax,ASTContext *context)

{
  VariableDimensionSyntax *syntax_00;
  int iVar1;
  bool bVar2;
  DeclaratorSyntax *pDVar3;
  Symbol *pSVar4;
  Type *pTVar5;
  int32_t in_R8D;
  SourceRange range;
  string_view sVar6;
  string_view name;
  EvaluatedDimension dim;
  undefined8 local_50;
  ulong local_48;
  
  if ((syntax->members).elements._M_extent._M_extent_value == 0) {
    sVar6 = (string_view)ZEXT816(0);
  }
  else {
    local_50 = &syntax->members;
    local_48 = 0;
    pDVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference
                       ((iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)&local_50);
    if ((pDVar3->dimensions).
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
        _M_extent_value == 0) {
      sVar6 = parsing::Token::valueText(&pDVar3->name);
    }
    else {
      syntax_00 = *(pDVar3->dimensions).
                   super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                   _M_ptr;
      ASTContext::evalUnpackedDimension((EvaluatedDimension *)&local_50,context,syntax_00);
      sVar6 = (string_view)ZEXT816(0);
      if ((DimensionKind)local_50 - Range < 2) {
        range = slang::syntax::SyntaxNode::sourceRange(&syntax_00->super_SyntaxNode);
        bVar2 = ASTContext::requirePositive
                          (context,(optional<int>)((ulong)local_50 >> 0x20 | 0x100000000),range);
        sVar6 = (string_view)ZEXT816(0);
        if (bVar2) {
          bVar2 = ASTContext::requirePositive
                            (context,(optional<int>)(local_48 & 0xffffffff | 0x100000000),range);
          sVar6 = (string_view)ZEXT816(0);
          if (bVar2) {
            sVar6 = parsing::Token::valueText(&pDVar3->name);
            name._M_len = sVar6._M_str;
            iVar1 = local_50._4_4_;
            if ((int)local_48 < local_50._4_4_) {
              iVar1 = (int)local_48;
            }
            name._M_str._0_4_ = iVar1;
            name._M_str._4_4_ = 0;
            sVar6 = getEnumValueName((ast *)comp,(Compilation *)sVar6._M_len,name,in_R8D);
          }
        }
      }
    }
  }
  pSVar4 = Scope::find((context->scope).ptr,sVar6);
  if ((pSVar4 != (Symbol *)0x0) && (pSVar4->kind == EnumValue)) {
    pTVar5 = DeclaredType::getType((DeclaredType *)(pSVar4 + 1));
    pTVar5 = Type::getCanonicalType(pTVar5);
    if ((EnumTypeSyntax *)(pTVar5->super_Symbol).originatingSyntax == syntax) {
      pTVar5 = anon_unknown.dwarf_8fa307::createPackedDims(context,pTVar5,&syntax->dimensions);
      return pTVar5;
    }
  }
  return comp->errorType;
}

Assistant:

const Type& EnumType::findDefinition(Compilation& comp, const EnumTypeSyntax& syntax,
                                     const ASTContext& context) {
    // The enum type and all of its values should have already been created and
    // added to the parent scope. We just need to find it so we can hook up our caller.
    // To do that we're going to try to look up our first member, which should have
    // the right type. If we don't find it we know an error must have occurred during
    // type creation.
    std::string_view name;
    if (!syntax.members.empty()) {
        auto member = *syntax.members.begin();
        if (member->dimensions.empty())
            name = member->name.valueText();
        else {
            auto dimList = member->dimensions[0];
            auto dim = context.evalUnpackedDimension(*dimList);
            if (dim.isRange()) {
                SourceRange dimRange = dimList->sourceRange();
                if (context.requirePositive(std::optional(dim.range.left), dimRange) &&
                    context.requirePositive(std::optional(dim.range.right), dimRange)) {
                    name = getEnumValueName(comp, member->name.valueText(), dim.range.lower());
                }
            }
        }
    }

    auto symbol = context.scope->find(name);
    if (symbol && symbol->kind == SymbolKind::EnumValue) {
        auto& type = symbol->as<EnumValueSymbol>().getType().getCanonicalType();
        if (type.getSyntax() == &syntax)
            return createPackedDims(context, &type, syntax.dimensions);
    }

    return comp.getErrorType();
}